

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O3

AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> __thiscall
chaiscript::optimizer::
Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>
::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>
           *this,AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                 *p)

{
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  pointer *__ptr;
  long *local_b8;
  long *local_b0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  
  local_30 = (long *)*in_RDX;
  *in_RDX = 0;
  Partial_Fold::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Partial_Fold *)&local_88,p);
  local_38 = local_88;
  local_88 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_38;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_38 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Unused_Return::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Unused_Return *)&local_90,p);
  local_40 = local_90;
  local_90 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_40;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_40 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Constant_Fold::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Constant_Fold *)&local_98,p);
  local_48 = local_98;
  local_98 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_48;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_48 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  If::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>((If *)&local_a0,p);
  local_58 = local_a0;
  local_a0 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_58;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_58 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Return::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Return *)&local_50,p);
  local_60 = local_50;
  local_50 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_60;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_60 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Dead_Code::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Dead_Code *)&local_a8,p);
  local_68 = local_a8;
  local_a8 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_68;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_68 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Block::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Block *)&local_b0,p);
  local_70 = local_b0;
  local_b0 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_70;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_70 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  For_Loop::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((For_Loop *)&local_b8,p);
  local_80 = local_b8;
  local_b8 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)local_80;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    local_80 = (long *)*in_RDX;
  }
  *in_RDX = 0;
  Assign_Decl::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Assign_Decl *)&local_78,p);
  plVar2 = local_78;
  local_78 = (long *)0x0;
  plVar1 = (long *)*in_RDX;
  *in_RDX = (long)plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 0x18))();
    }
  }
  local_78 = (long *)0x0;
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 0x18))();
  }
  local_80 = (long *)0x0;
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 0x18))();
  }
  local_b8 = (long *)0x0;
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x18))();
  }
  local_70 = (long *)0x0;
  if (local_b0 != (long *)0x0) {
    (**(code **)(*local_b0 + 0x18))();
  }
  local_b0 = (long *)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 0x18))();
  }
  local_68 = (long *)0x0;
  if (local_a8 != (long *)0x0) {
    (**(code **)(*local_a8 + 0x18))();
  }
  local_a8 = (long *)0x0;
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x18))();
  }
  local_60 = (long *)0x0;
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 0x18))();
  }
  local_50 = (long *)0x0;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 0x18))();
  }
  local_58 = (long *)0x0;
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 0x18))();
  }
  local_a0 = (long *)0x0;
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 0x18))();
  }
  local_48 = (long *)0x0;
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 0x18))();
  }
  local_98 = (long *)0x0;
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x18))();
  }
  local_40 = (long *)0x0;
  if (local_90 != (long *)0x0) {
    (**(code **)(*local_90 + 0x18))();
  }
  local_90 = (long *)0x0;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x18))();
  }
  local_38 = (long *)0x0;
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x18))();
  }
  local_88 = (long *)0x0;
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x18))();
  }
  *(long *)this = *in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<Tracer> p) {
        ((p = static_cast<T &>(*this).optimize(std::move(p))), ...);
        return p;
      }